

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeUVMappingProcess.cpp
# Opt level: O2

void __thiscall
Assimp::ComputeUVMappingProcess::Execute(ComputeUVMappingProcess *this,aiScene *pScene)

{
  uint uVar1;
  aiMaterialProperty *paVar2;
  aiMaterialProperty *paVar3;
  aiMesh *mesh;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Logger *pLVar7;
  char *pcVar8;
  char *pcVar9;
  _List_iterator<Assimp::ComputeUVMappingProcess::MappingInfo> _Var10;
  aiVector3D *out;
  DeadlyImportError *this_00;
  ulong uVar11;
  aiVector3D *extraout_RDX;
  aiMesh *paVar12;
  aiVector3D *this_01;
  aiMaterial *this_02;
  uint a2;
  ulong uVar13;
  uint idx;
  aiTextureMapping *local_498;
  value_type local_48c;
  aiMaterial *local_478;
  aiScene *local_470;
  ulong local_468;
  ulong local_460;
  list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  mappingStack;
  char buffer [1024];
  
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"GenUVCoordsProcess begin");
  if ((pScene->mFlags & 8) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&mappingStack,
               "Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here"
               ,(allocator *)&local_48c);
    DeadlyImportError::DeadlyImportError(this_00,(string *)&mappingStack);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mappingStack.
  super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&mappingStack;
  mappingStack.
  super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  ._M_impl._M_node._M_size = 0;
  uVar13 = 0;
  local_470 = pScene;
  mappingStack.
  super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       mappingStack.
       super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (pScene->mNumMaterials <= uVar13) {
      pLVar7 = DefaultLogger::get();
      Logger::debug(pLVar7,"GenUVCoordsProcess finished");
      std::__cxx11::
      _List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
      ::_M_clear(&mappingStack.
                  super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                );
      return;
    }
    std::__cxx11::
    list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
    ::clear(&mappingStack);
    this_02 = pScene->mMaterials[uVar13];
    uVar11 = 0;
    local_478 = this_02;
    local_468 = uVar13;
    while (uVar11 < this_02->mNumProperties) {
      paVar2 = this_02->mProperties[uVar11];
      local_460 = uVar11;
      iVar5 = strcmp((paVar2->mKey).data,"$tex.mapping");
      if ((iVar5 == 0) &&
         (local_498 = (aiTextureMapping *)paVar2->mData, *local_498 != aiTextureMapping_UV)) {
        bVar4 = DefaultLogger::isNullLogger();
        if (!bVar4) {
          pcVar8 = TextureTypeToString(paVar2->mSemantic);
          uVar1 = paVar2->mIndex;
          pcVar9 = MappingTypeToString(*local_498);
          snprintf(buffer,0x400,"Found non-UV mapped texture (%s,%u). Mapping type: %s",pcVar8,
                   (ulong)uVar1,pcVar9);
          pLVar7 = DefaultLogger::get();
          Logger::info(pLVar7,buffer);
        }
        pScene = local_470;
        if (*local_498 != aiTextureMapping_OTHER) {
          local_48c.axis.x = 0.0;
          local_48c.axis.y = 1.0;
          local_48c.axis.z = 0.0;
          local_48c.uv = 0;
          uVar1 = this_02->mNumProperties;
          local_48c.type = *local_498;
          for (uVar13 = 0; uVar1 != uVar13; uVar13 = uVar13 + 1) {
            paVar3 = this_02->mProperties[uVar13];
            if (((paVar3->mSemantic == paVar2->mSemantic) && (paVar3->mIndex == paVar2->mIndex)) &&
               (iVar5 = strcmp((paVar3->mKey).data,"$tex.mapaxis"), iVar5 == 0)) {
              local_48c.axis.z = *(float *)(paVar3->mData + 8);
              local_48c.axis._0_8_ = *(undefined8 *)paVar3->mData;
              this_02 = local_478;
              break;
            }
            this_02 = local_478;
          }
          idx = 99999999;
          _Var10 = std::
                   __find_if<std::_List_iterator<Assimp::ComputeUVMappingProcess::MappingInfo>,__gnu_cxx::__ops::_Iter_equals_val<Assimp::ComputeUVMappingProcess::MappingInfo_const>>
                             (mappingStack.
                              super__List_base<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
                              ._M_impl._M_node.super__List_node_base._M_next,
                              (_List_node_base *)&mappingStack,&local_48c);
          if ((_List_node_base *)&mappingStack == _Var10._M_node) {
            for (uVar13 = 0; uVar13 < pScene->mNumMeshes; uVar13 = uVar13 + 1) {
              mesh = pScene->mMeshes[uVar13];
              uVar1 = idx;
              if (local_468 == mesh->mMaterialIndex) {
                uVar6 = FindEmptyUVChannel(mesh);
                uVar1 = idx;
                if ((uVar6 != 0xffffffff) && ((ulong)mesh->mNumVertices != 0)) {
                  uVar11 = (ulong)mesh->mNumVertices * 0xc;
                  out = (aiVector3D *)operator_new__(uVar11);
                  uVar11 = uVar11 - 0xc;
                  paVar12 = (aiMesh *)0x0;
                  this_01 = out;
                  memset(out,0,(uVar11 - uVar11 % 0xc) + 0xc);
                  mesh->mTextureCoords[uVar6] = out;
                  switch(*local_498) {
                  case aiTextureMapping_SPHERE:
                    ComputeSphereMapping
                              ((ComputeUVMappingProcess *)this_01,mesh,&local_48c.axis,out);
                    break;
                  case aiTextureMapping_CYLINDER:
                    ComputeCylinderMapping
                              ((ComputeUVMappingProcess *)this_01,mesh,&local_48c.axis,out);
                    break;
                  case aiTextureMapping_BOX:
                    ComputeBoxMapping((ComputeUVMappingProcess *)this_01,paVar12,extraout_RDX);
                    break;
                  case aiTextureMapping_PLANE:
                    ComputePlaneMapping((ComputeUVMappingProcess *)this_01,mesh,&local_48c.axis,out)
                    ;
                    break;
                  default:
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/ComputeUVMappingProcess.cpp"
                                  ,0x1e4,
                                  "virtual void Assimp::ComputeUVMappingProcess::Execute(aiScene *)"
                                 );
                  }
                  pScene = local_470;
                  this_02 = local_478;
                  uVar1 = uVar6;
                  if ((uVar13 != 0) && (idx != uVar6)) {
                    pLVar7 = DefaultLogger::get();
                    Logger::warn(pLVar7,
                                 "UV index mismatch. Not all meshes assigned to this material have equal numbers of UV channels. The UV index stored in  the material structure does therefore not apply for all meshes. "
                                );
                    pScene = local_470;
                    this_02 = local_478;
                  }
                }
              }
              idx = uVar1;
            }
            local_48c.uv = idx;
            std::__cxx11::
            list<Assimp::ComputeUVMappingProcess::MappingInfo,_std::allocator<Assimp::ComputeUVMappingProcess::MappingInfo>_>
            ::push_back(&mappingStack,&local_48c);
          }
          else {
            idx = *(uint *)&_Var10._M_node[2]._M_next;
          }
          *local_498 = aiTextureMapping_UV;
          aiMaterial::AddProperty<unsigned_int>
                    (this_02,&idx,1,"$tex.uvwsrc",paVar2->mSemantic,paVar2->mIndex);
        }
      }
      uVar11 = local_460 + 1;
    }
    uVar13 = local_468 + 1;
  } while( true );
}

Assistant:

void ComputeUVMappingProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess begin");
    char buffer[1024];

    if (pScene->mFlags & AI_SCENE_FLAGS_NON_VERBOSE_FORMAT)
        throw DeadlyImportError("Post-processing order mismatch: expecting pseudo-indexed (\"verbose\") vertices here");

    std::list<MappingInfo> mappingStack;

    /*  Iterate through all materials and search for non-UV mapped textures
     */
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
    {
        mappingStack.clear();
        aiMaterial* mat = pScene->mMaterials[i];
        for (unsigned int a = 0; a < mat->mNumProperties;++a)
        {
            aiMaterialProperty* prop = mat->mProperties[a];
            if (!::strcmp( prop->mKey.data, "$tex.mapping"))
            {
                aiTextureMapping& mapping = *((aiTextureMapping*)prop->mData);
                if (aiTextureMapping_UV != mapping)
                {
                    if (!DefaultLogger::isNullLogger())
                    {
                        ai_snprintf(buffer, 1024, "Found non-UV mapped texture (%s,%u). Mapping type: %s",
                            TextureTypeToString((aiTextureType)prop->mSemantic),prop->mIndex,
                            MappingTypeToString(mapping));

                        ASSIMP_LOG_INFO(buffer);
                    }

                    if (aiTextureMapping_OTHER == mapping)
                        continue;

                    MappingInfo info (mapping);

                    // Get further properties - currently only the major axis
                    for (unsigned int a2 = 0; a2 < mat->mNumProperties;++a2)
                    {
                        aiMaterialProperty* prop2 = mat->mProperties[a2];
                        if (prop2->mSemantic != prop->mSemantic || prop2->mIndex != prop->mIndex)
                            continue;

                        if ( !::strcmp( prop2->mKey.data, "$tex.mapaxis"))  {
                            info.axis = *((aiVector3D*)prop2->mData);
                            break;
                        }
                    }

                    unsigned int idx( 99999999 );

                    // Check whether we have this mapping mode already
                    std::list<MappingInfo>::iterator it = std::find (mappingStack.begin(),mappingStack.end(), info);
                    if (mappingStack.end() != it)
                    {
                        idx = (*it).uv;
                    }
                    else
                    {
                        /*  We have found a non-UV mapped texture. Now
                        *   we need to find all meshes using this material
                        *   that we can compute UV channels for them.
                        */
                        for (unsigned int m = 0; m < pScene->mNumMeshes;++m)
                        {
                            aiMesh* mesh = pScene->mMeshes[m];
                            unsigned int outIdx = 0;
                            if ( mesh->mMaterialIndex != i || ( outIdx = FindEmptyUVChannel(mesh) ) == UINT_MAX ||
                                !mesh->mNumVertices)
                            {
                                continue;
                            }

                            // Allocate output storage
                            aiVector3D* p = mesh->mTextureCoords[outIdx] = new aiVector3D[mesh->mNumVertices];

                            switch (mapping)
                            {
                            case aiTextureMapping_SPHERE:
                                ComputeSphereMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_CYLINDER:
                                ComputeCylinderMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_PLANE:
                                ComputePlaneMapping(mesh,info.axis,p);
                                break;
                            case aiTextureMapping_BOX:
                                ComputeBoxMapping(mesh,p);
                                break;
                            default:
                                ai_assert(false);
                            }
                            if (m && idx != outIdx)
                            {
                                ASSIMP_LOG_WARN("UV index mismatch. Not all meshes assigned to "
                                    "this material have equal numbers of UV channels. The UV index stored in  "
                                    "the material structure does therefore not apply for all meshes. ");
                            }
                            idx = outIdx;
                        }
                        info.uv = idx;
                        mappingStack.push_back(info);
                    }

                    // Update the material property list
                    mapping = aiTextureMapping_UV;
                    ((aiMaterial*)mat)->AddProperty(&idx,1,AI_MATKEY_UVWSRC(prop->mSemantic,prop->mIndex));
                }
            }
        }
    }
    ASSIMP_LOG_DEBUG("GenUVCoordsProcess finished");
}